

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O2

int __thiscall
particleSamples::read_in_particle_samples_UrQMD_3p3_mixed_event(particleSamples *this)

{
  pretty_ostream *this_00;
  vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
  *this_01;
  istream *piVar1;
  double *pdVar2;
  int iVar3;
  bool bVar4;
  allocator local_4a1;
  istream *local_4a0;
  int n_particle;
  particleSamples *local_490;
  long local_488;
  int local_47c;
  int urqmd_iso3;
  int urqmd_pid;
  double temp_mass;
  int urqmd_charge;
  int parent_proc_type;
  particle_info temp_particle_info;
  double dummy;
  string temp_string;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  stringstream temp1;
  stringstream temp2;
  
  clear_out_previous_record(this,this->full_particle_list_mixed_event);
  temp_string._M_dataplus._M_p = (pointer)&temp_string.field_2;
  temp_string._M_string_length = 0;
  temp_string.field_2._M_local_buf[0] = '\0';
  local_4a0 = (istream *)&this->inputfile_mixed_event;
  this_00 = &this->messager;
  local_488 = 0;
  iVar3 = 0;
  local_490 = this;
  while (local_47c = iVar3, iVar3 < local_490->event_buffer_size) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>(local_4a0,(string *)&temp_string)
    ;
    if (((&local_490->field_0x3f0)[*(long *)(*(long *)&local_490->inputfile_mixed_event + -0x18)] &
        2) != 0) break;
    this_01 = (vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
               *)local_490->full_particle_list_mixed_event;
    _temp1 = (undefined8 *)operator_new(0x18);
    *_temp1 = 0;
    _temp1[1] = 0;
    _temp1[2] = 0;
    std::
    vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
    ::emplace_back<std::vector<particle_info,std::allocator<particle_info>>*>
              (this_01,(vector<particle_info,_std::allocator<particle_info>_> **)&temp1);
    iVar3 = 0xd;
    while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                (local_4a0,(string *)&temp_string);
    }
    std::getline<char,std::char_traits<char>,std::allocator<char>>(local_4a0,(string *)&temp_string)
    ;
    std::__cxx11::stringstream::stringstream
              ((stringstream *)&temp1,(string *)&temp_string,_S_out|_S_in);
    std::istream::operator>>((istream *)&temp1,&n_particle);
    std::getline<char,std::char_traits<char>,std::allocator<char>>(local_4a0,(string *)&temp_string)
    ;
    for (iVar3 = 0; iVar3 < n_particle; iVar3 = iVar3 + 1) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                (local_4a0,(string *)&temp_string);
      std::__cxx11::stringstream::stringstream
                ((stringstream *)&temp2,(string *)&temp_string,_S_out|_S_in);
      piVar1 = std::istream::_M_extract<double>((double *)&temp2);
      piVar1 = std::istream::_M_extract<double>((double *)piVar1);
      piVar1 = std::istream::_M_extract<double>((double *)piVar1);
      piVar1 = std::istream::_M_extract<double>((double *)piVar1);
      piVar1 = std::istream::_M_extract<double>((double *)piVar1);
      piVar1 = std::istream::_M_extract<double>((double *)piVar1);
      piVar1 = std::istream::_M_extract<double>((double *)piVar1);
      piVar1 = std::istream::_M_extract<double>((double *)piVar1);
      piVar1 = std::istream::_M_extract<double>((double *)piVar1);
      piVar1 = (istream *)std::istream::operator>>(piVar1,&urqmd_pid);
      piVar1 = (istream *)std::istream::operator>>(piVar1,&urqmd_iso3);
      pdVar2 = (double *)std::istream::operator>>(piVar1,&urqmd_charge);
      piVar1 = std::istream::_M_extract<double>(pdVar2);
      piVar1 = std::istream::_M_extract<double>((double *)piVar1);
      std::istream::operator>>(piVar1,&parent_proc_type);
      piVar1 = std::istream::_M_extract<double>((double *)&temp2);
      piVar1 = std::istream::_M_extract<double>((double *)piVar1);
      piVar1 = std::istream::_M_extract<double>((double *)piVar1);
      piVar1 = std::istream::_M_extract<double>((double *)piVar1);
      piVar1 = std::istream::_M_extract<double>((double *)piVar1);
      piVar1 = std::istream::_M_extract<double>((double *)piVar1);
      piVar1 = std::istream::_M_extract<double>((double *)piVar1);
      std::istream::_M_extract<double>((double *)piVar1);
      temp_particle_info.mass = temp_mass;
      temp_particle_info.monval = get_pdg_id(local_490,urqmd_pid,urqmd_iso3);
      if (temp_particle_info.monval == 0) {
        std::operator<<((ostream *)this_00,"nev = ");
        std::ostream::operator<<(this_00,(int)local_488);
        std::__cxx11::string::string((string *)&local_360,"error",&local_4a1);
        pretty_ostream::flush(this_00,&local_360);
        std::__cxx11::string::~string((string *)&local_360);
        std::operator<<((ostream *)this_00,"nparticles = ");
        std::ostream::operator<<(this_00,n_particle);
        std::operator<<((ostream *)this_00,", ipart = ");
        std::ostream::operator<<(this_00,iVar3);
        std::__cxx11::string::string((string *)&local_380,"error",&local_4a1);
        pretty_ostream::flush(this_00,&local_380);
        std::__cxx11::string::~string((string *)&local_380);
        std::operator<<((ostream *)this_00,"mass = ");
        std::ostream::_M_insert<double>(temp_particle_info.mass);
        std::operator<<((ostream *)this_00,", E = ");
        std::ostream::_M_insert<double>(temp_particle_info.E);
        std::operator<<((ostream *)this_00,", px = ");
        std::ostream::_M_insert<double>(temp_particle_info.px);
        std::operator<<((ostream *)this_00,", py = ");
        std::ostream::_M_insert<double>(temp_particle_info.py);
        std::operator<<((ostream *)this_00,", pz = ");
        std::ostream::_M_insert<double>(temp_particle_info.pz);
        std::operator<<((ostream *)this_00,", t = ");
        std::ostream::_M_insert<double>(temp_particle_info.t);
        std::operator<<((ostream *)this_00,", x = ");
        std::ostream::_M_insert<double>(temp_particle_info.x);
        std::operator<<((ostream *)this_00,", y = ");
        std::ostream::_M_insert<double>(temp_particle_info.y);
        std::operator<<((ostream *)this_00,", z = ");
        std::ostream::_M_insert<double>(temp_particle_info.z);
        std::__cxx11::string::string((string *)&local_3a0,"error",&local_4a1);
        pretty_ostream::flush(this_00,&local_3a0);
        std::__cxx11::string::~string((string *)&local_3a0);
        std::operator<<((ostream *)this_00,"Ignore this particle!");
        std::__cxx11::string::string((string *)&local_3c0,"error",&local_4a1);
        pretty_ostream::flush(this_00,&local_3c0);
        std::__cxx11::string::~string((string *)&local_3c0);
      }
      else {
        std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                  ((local_490->full_particle_list_mixed_event->
                   super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[local_488],&temp_particle_info);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&temp2);
    }
    iVar3 = local_47c + n_particle;
    local_488 = local_488 + 1;
    std::__cxx11::stringstream::~stringstream((stringstream *)&temp1);
  }
  std::__cxx11::string::~string((string *)&temp_string);
  return 0;
}

Assistant:

int particleSamples::read_in_particle_samples_UrQMD_3p3_mixed_event() {
    // clean out the previous record
    clear_out_previous_record(full_particle_list_mixed_event);

    std::string temp_string;
    int n_particle;
    double dummy;
    int parent_proc_type;
    int ievent = 0;
    int urqmd_pid, urqmd_iso3, urqmd_charge;
    double temp_mass;
    int num_particles = 0;
    while (num_particles < event_buffer_size) {
        getline(inputfile_mixed_event, temp_string);

        if (inputfile_mixed_event.eof()) break;

        full_particle_list_mixed_event->push_back(new vector<particle_info>);

        // first skip the header
        for (int i = 0; i < 13; i++)
            getline(inputfile_mixed_event, temp_string);
        // then get number of particles within the event
        getline(inputfile_mixed_event, temp_string);
        std::stringstream temp1(temp_string);
        temp1 >> n_particle;
        // then get one useless line
        getline(inputfile_mixed_event, temp_string);

        for (int ipart = 0; ipart < n_particle; ipart++) {
            getline(inputfile_mixed_event, temp_string);
            std::stringstream temp2(temp_string);
            temp2 >> dummy >> dummy >> dummy >> dummy >> dummy >> dummy >> dummy
                >> dummy >> temp_mass >> urqmd_pid >> urqmd_iso3 >> urqmd_charge
                >> dummy >> dummy >> parent_proc_type;

            particle_info temp_particle_info;
            temp2 >> temp_particle_info.t >> temp_particle_info.x
                >> temp_particle_info.y >> temp_particle_info.z
                >> temp_particle_info.E >> temp_particle_info.px
                >> temp_particle_info.py >> temp_particle_info.pz;
            temp_particle_info.mass = temp_mass;
            temp_particle_info.monval = get_pdg_id(urqmd_pid, urqmd_iso3);
            if (temp_particle_info.monval == 0) {
                messager << "nev = " << ievent;
                messager.flush("error");
                messager << "nparticles = " << n_particle
                         << ", ipart = " << ipart;
                messager.flush("error");
                messager << "mass = " << temp_particle_info.mass
                         << ", E = " << temp_particle_info.E
                         << ", px = " << temp_particle_info.px
                         << ", py = " << temp_particle_info.py
                         << ", pz = " << temp_particle_info.pz
                         << ", t = " << temp_particle_info.t
                         << ", x = " << temp_particle_info.x
                         << ", y = " << temp_particle_info.y
                         << ", z = " << temp_particle_info.z;
                messager.flush("error");
                messager << "Ignore this particle!";
                messager.flush("error");
            } else {
                (*full_particle_list_mixed_event)[ievent]->push_back(
                    temp_particle_info);
            }
        }
        num_particles += n_particle;
        ievent++;
    }
    return (0);
}